

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

void __thiscall
nlohmann::detail::
serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::dump_escaped(serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               *this,string_t *s,bool ensure_ascii)

{
  array<char,_512UL> *paVar1;
  byte byte;
  element_type *peVar2;
  uint8_t uVar3;
  type_error *ptVar4;
  ulong __val;
  long lVar5;
  uint8_t state;
  byte local_dd;
  uint32_t codepoint;
  serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *local_d8;
  string sn;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  state = '\0';
  paVar1 = &this->string_buffer;
  local_dd = !ensure_ascii;
  __val = 0;
  lVar5 = 0;
  local_d8 = this;
  do {
    if (s->_M_string_length <= __val) {
      if (state != '\0') {
        sn._M_dataplus._M_p = (pointer)&sn.field_2;
        std::__cxx11::string::_M_construct((ulong)&sn,'\x03');
        snprintf(sn._M_dataplus._M_p,sn._M_string_length,"%.2X",
                 (ulong)(byte)(s->_M_dataplus)._M_p[s->_M_string_length - 1]);
        ptVar4 = (type_error *)__cxa_allocate_exception(0x20);
        std::operator+(&local_b0,"incomplete UTF-8 string; last byte: 0x",&sn);
        type_error::create(ptVar4,0x13c,&local_b0);
        __cxa_throw(ptVar4,&type_error::typeinfo,exception::~exception);
      }
      if (lVar5 != 0) {
        peVar2 = (local_d8->o).
                 super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        (*peVar2->_vptr_output_adapter_protocol[1])(peVar2,paVar1,lVar5);
      }
      return;
    }
    byte = (s->_M_dataplus)._M_p[__val];
    uVar3 = decode(&state,&codepoint,byte);
    if (uVar3 == '\0') {
      switch(codepoint) {
      case 8:
        (paVar1->_M_elems + lVar5)[0] = '\\';
        (paVar1->_M_elems + lVar5)[1] = 'b';
        break;
      case 9:
        (paVar1->_M_elems + lVar5)[0] = '\\';
        (paVar1->_M_elems + lVar5)[1] = 't';
        break;
      case 10:
        (paVar1->_M_elems + lVar5)[0] = '\\';
        (paVar1->_M_elems + lVar5)[1] = 'n';
        break;
      case 0xb:
switchD_0012004f_caseD_b:
        if ((0x1f < codepoint & (codepoint < 0x7f | local_dd)) == 0) {
          if (codepoint < 0x10000) {
            snprintf(paVar1->_M_elems + lVar5,7,"\\u%04x",(ulong)codepoint);
            lVar5 = lVar5 + 6;
          }
          else {
            snprintf(paVar1->_M_elems + lVar5,0xd,"\\u%04x\\u%04x",
                     (ulong)((codepoint >> 10) + 0xd7c0 & 0xffff),
                     (ulong)(codepoint & 0x3ff | 0xdc00));
            lVar5 = lVar5 + 0xc;
          }
        }
        else {
          paVar1->_M_elems[lVar5] = (s->_M_dataplus)._M_p[__val];
          lVar5 = lVar5 + 1;
        }
        goto LAB_001200e6;
      case 0xc:
        (paVar1->_M_elems + lVar5)[0] = '\\';
        (paVar1->_M_elems + lVar5)[1] = 'f';
        break;
      case 0xd:
        (paVar1->_M_elems + lVar5)[0] = '\\';
        (paVar1->_M_elems + lVar5)[1] = 'r';
        break;
      default:
        if (codepoint == 0x22) {
          (paVar1->_M_elems + lVar5)[0] = '\\';
          (paVar1->_M_elems + lVar5)[1] = '\"';
        }
        else {
          if (codepoint != 0x5c) goto switchD_0012004f_caseD_b;
          (paVar1->_M_elems + lVar5)[0] = '\\';
          (paVar1->_M_elems + lVar5)[1] = '\\';
        }
      }
      lVar5 = lVar5 + 2;
LAB_001200e6:
      if (lVar5 - 500U < 0xd) {
        peVar2 = (local_d8->o).
                 super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        (*peVar2->_vptr_output_adapter_protocol[1])(peVar2,paVar1,lVar5);
        lVar5 = 0;
      }
    }
    else {
      if (uVar3 == '\x01') {
        sn._M_dataplus._M_p = (pointer)&sn.field_2;
        std::__cxx11::string::_M_construct((ulong)&sn,'\x03');
        snprintf(sn._M_dataplus._M_p,sn._M_string_length,"%.2X",(ulong)byte);
        ptVar4 = (type_error *)__cxa_allocate_exception(0x20);
        std::__cxx11::to_string(&local_90,__val);
        std::operator+(&local_70,"invalid UTF-8 byte at index ",&local_90);
        std::operator+(&local_50,&local_70,": 0x");
        std::operator+(&local_b0,&local_50,&sn);
        type_error::create(ptVar4,0x13c,&local_b0);
        __cxa_throw(ptVar4,&type_error::typeinfo,exception::~exception);
      }
      if (!ensure_ascii) {
        paVar1->_M_elems[lVar5] = (s->_M_dataplus)._M_p[__val];
        lVar5 = lVar5 + 1;
      }
    }
    __val = __val + 1;
  } while( true );
}

Assistant:

void dump_escaped(const string_t& s, const bool ensure_ascii)
    {
        uint32_t codepoint;
        uint8_t state = UTF8_ACCEPT;
        std::size_t bytes = 0;  // number of bytes written to string_buffer

        for (std::size_t i = 0; i < s.size(); ++i)
        {
            const auto byte = static_cast<uint8_t>(s[i]);

            switch (decode(state, codepoint, byte))
            {
                case UTF8_ACCEPT:  // decode found a new code point
                {
                    switch (codepoint)
                    {
                        case 0x08: // backspace
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 'b';
                            break;
                        }

                        case 0x09: // horizontal tab
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 't';
                            break;
                        }

                        case 0x0A: // newline
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 'n';
                            break;
                        }

                        case 0x0C: // formfeed
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 'f';
                            break;
                        }

                        case 0x0D: // carriage return
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 'r';
                            break;
                        }

                        case 0x22: // quotation mark
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = '\"';
                            break;
                        }

                        case 0x5C: // reverse solidus
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = '\\';
                            break;
                        }

                        default:
                        {
                            // escape control characters (0x00..0x1F) or, if
                            // ensure_ascii parameter is used, non-ASCII characters
                            if ((codepoint <= 0x1F) or (ensure_ascii and (codepoint >= 0x7F)))
                            {
                                if (codepoint <= 0xFFFF)
                                {
                                    std::snprintf(string_buffer.data() + bytes, 7, "\\u%04x",
                                                  static_cast<uint16_t>(codepoint));
                                    bytes += 6;
                                }
                                else
                                {
                                    std::snprintf(string_buffer.data() + bytes, 13, "\\u%04x\\u%04x",
                                                  static_cast<uint16_t>(0xD7C0 + (codepoint >> 10)),
                                                  static_cast<uint16_t>(0xDC00 + (codepoint & 0x3FF)));
                                    bytes += 12;
                                }
                            }
                            else
                            {
                                // copy byte to buffer (all previous bytes
                                // been copied have in default case above)
                                string_buffer[bytes++] = s[i];
                            }
                            break;
                        }
                    }

                    // write buffer and reset index; there must be 13 bytes
                    // left, as this is the maximal number of bytes to be
                    // written ("\uxxxx\uxxxx\0") for one code point
                    if (string_buffer.size() - bytes < 13)
                    {
                        o->write_characters(string_buffer.data(), bytes);
                        bytes = 0;
                    }
                    break;
                }

                case UTF8_REJECT:  // decode found invalid UTF-8 byte
                {
                    std::string sn(3, '\0');
                    snprintf(&sn[0], sn.size(), "%.2X", byte);
                    JSON_THROW(type_error::create(316, "invalid UTF-8 byte at index " + std::to_string(i) + ": 0x" + sn));
                }

                default:  // decode found yet incomplete multi-byte code point
                {
                    if (not ensure_ascii)
                    {
                        // code point will not be escaped - copy byte to buffer
                        string_buffer[bytes++] = s[i];
                    }
                    break;
                }
            }
        }

        if (JSON_LIKELY(state == UTF8_ACCEPT))
        {
            // write buffer
            if (bytes > 0)
            {
                o->write_characters(string_buffer.data(), bytes);
            }
        }
        else
        {
            // we finish reading, but do not accept: string was incomplete
            std::string sn(3, '\0');
            snprintf(&sn[0], sn.size(), "%.2X", static_cast<uint8_t>(s.back()));
            JSON_THROW(type_error::create(316, "incomplete UTF-8 string; last byte: 0x" + sn));
        }
    }